

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderIntegerFunctionTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderIntegerFunctionTests::init
          (ShaderIntegerFunctionTests *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int iVar2;
  TestNode *pTVar3;
  TestNode *pTVar4;
  ulong extraout_RAX;
  ulong uVar5;
  ulong extraout_RAX_00;
  long lVar6;
  int iVar7;
  int shaderTypeNdx;
  ShaderType SVar8;
  int prec;
  Precision PVar9;
  
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"uaddcarry",
             "uaddcarry");
  tcu::TestNode::addChild((TestNode *)this,pTVar3);
  lVar6 = 0;
  do {
    if (lVar6 != 0) {
      if (lVar6 == 2) {
        pTVar3 = (TestNode *)operator_new(0x70);
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)pTVar3,
                   (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                   "usubborrow","usubborrow");
        tcu::TestNode::addChild((TestNode *)this,pTVar3);
        lVar6 = 0;
        do {
          if (lVar6 != 0) {
            if (lVar6 == 2) {
              pTVar3 = (TestNode *)operator_new(0x70);
              tcu::TestCaseGroup::TestCaseGroup
                        ((TestCaseGroup *)pTVar3,
                         (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                         "umulextended","umulextended");
              tcu::TestNode::addChild((TestNode *)this,pTVar3);
              for (lVar6 = 0; lVar6 == 0; lVar6 = lVar6 + 1) {
LAB_012744c1:
              }
              if (lVar6 == 2) {
                pTVar3 = (TestNode *)operator_new(0x70);
                tcu::TestCaseGroup::TestCaseGroup
                          ((TestCaseGroup *)pTVar3,
                           (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                           "imulextended","imulextended");
                tcu::TestNode::addChild((TestNode *)this,pTVar3);
                for (lVar6 = 0; lVar6 == 1; lVar6 = lVar6 + 1) {
LAB_0127459c:
                }
                if (lVar6 == 2) {
                  pTVar3 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar3,
                             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,"bitfieldextract","bitfieldextract");
                  tcu::TestNode::addChild((TestNode *)this,pTVar3);
                  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
                    iVar1 = (&DAT_018a3fd8)[lVar6];
                    for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                      for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                          PVar9 = PVar9 + PRECISION_MEDIUMP) {
                        for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_LAST;
                            SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                          pTVar4 = (TestNode *)operator_new(0x280);
                          BitfieldExtractCase::BitfieldExtractCase
                                    ((BitfieldExtractCase *)pTVar4,
                                     (this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar7,PVar9,
                                     SVar8);
                          tcu::TestNode::addChild(pTVar3,pTVar4);
                        }
                      }
                    }
                  }
                  pTVar3 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar3,
                             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,"bitfieldinsert","bitfieldinsert");
                  tcu::TestNode::addChild((TestNode *)this,pTVar3);
                  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
                    iVar1 = (&DAT_018a3fd8)[lVar6];
                    for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                      for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                          PVar9 = PVar9 + PRECISION_MEDIUMP) {
                        for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_LAST;
                            SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                          pTVar4 = (TestNode *)operator_new(0x280);
                          BitfieldInsertCase::BitfieldInsertCase
                                    ((BitfieldInsertCase *)pTVar4,
                                     (this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar7,PVar9,
                                     SVar8);
                          tcu::TestNode::addChild(pTVar3,pTVar4);
                        }
                      }
                    }
                  }
                  pTVar3 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar3,
                             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,"bitfieldreverse","bitfieldreverse");
                  tcu::TestNode::addChild((TestNode *)this,pTVar3);
                  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
                    iVar1 = (&DAT_018a3fd8)[lVar6];
                    for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                      for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                          PVar9 = PVar9 + PRECISION_MEDIUMP) {
                        for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_LAST;
                            SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                          pTVar4 = (TestNode *)operator_new(0x280);
                          BitfieldReverseCase::BitfieldReverseCase
                                    ((BitfieldReverseCase *)pTVar4,
                                     (this->super_TestCaseGroup).m_context,iVar1 + -1 + iVar7,PVar9,
                                     SVar8);
                          tcu::TestNode::addChild(pTVar3,pTVar4);
                        }
                      }
                    }
                  }
                  pTVar3 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar3,
                             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,"bitcount","bitcount");
                  tcu::TestNode::addChild((TestNode *)this,pTVar3);
                  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
                    iVar1 = (&DAT_018a3fd8)[lVar6];
                    for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                      for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                          PVar9 = PVar9 + PRECISION_MEDIUMP) {
                        for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_LAST;
                            SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                          pTVar4 = (TestNode *)operator_new(0x280);
                          BitCountCase::BitCountCase
                                    ((BitCountCase *)pTVar4,(this->super_TestCaseGroup).m_context,
                                     iVar1 + -1 + iVar7,PVar9,SVar8);
                          tcu::TestNode::addChild(pTVar3,pTVar4);
                        }
                      }
                    }
                  }
                  pTVar3 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar3,
                             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,"findlsb","findlsb");
                  tcu::TestNode::addChild((TestNode *)this,pTVar3);
                  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
                    iVar1 = (&DAT_018a3fd8)[lVar6];
                    for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                      for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                          PVar9 = PVar9 + PRECISION_MEDIUMP) {
                        for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_LAST;
                            SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                          pTVar4 = (TestNode *)operator_new(0x280);
                          FindLSBCase::FindLSBCase
                                    ((FindLSBCase *)pTVar4,(this->super_TestCaseGroup).m_context,
                                     iVar1 + -1 + iVar7,PVar9,SVar8);
                          tcu::TestNode::addChild(pTVar3,pTVar4);
                        }
                      }
                    }
                  }
                  pTVar3 = (TestNode *)operator_new(0x70);
                  tcu::TestCaseGroup::TestCaseGroup
                            ((TestCaseGroup *)pTVar3,
                             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,"findmsb","findmsb");
                  tcu::TestNode::addChild((TestNode *)this,pTVar3);
                  uVar5 = extraout_RAX;
                  for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
                    iVar1 = (&DAT_018a3fd8)[lVar6];
                    uVar5 = 1;
                    for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
                      uVar5 = (ulong)(iVar1 - 1U);
                      for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                          PVar9 = PVar9 + PRECISION_MEDIUMP) {
                        for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_LAST;
                            SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                          pTVar4 = (TestNode *)operator_new(0x280);
                          FindMSBCase::FindMSBCase
                                    ((FindMSBCase *)pTVar4,(this->super_TestCaseGroup).m_context,
                                     (iVar1 - 1U) + iVar7,PVar9,SVar8);
                          tcu::TestNode::addChild(pTVar3,pTVar4);
                          uVar5 = extraout_RAX_00;
                        }
                      }
                    }
                  }
                  return (int)uVar5;
                }
                iVar1 = (&DAT_018a3fd8)[lVar6];
                iVar7 = 1;
LAB_01274529:
                if (iVar7 != 5) {
                  iVar2 = 0;
                  do {
                    if (iVar2 == 2) {
                      for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_LAST;
                          SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                        pTVar4 = (TestNode *)operator_new(0x280);
                        ImulExtendedCase::ImulExtendedCase
                                  ((ImulExtendedCase *)pTVar4,(this->super_TestCaseGroup).m_context,
                                   iVar1 + -1 + iVar7,PRECISION_HIGHP,SVar8);
                        tcu::TestNode::addChild(pTVar3,pTVar4);
                      }
                    }
                    else if (iVar2 == 3) goto LAB_0127458e;
                    iVar2 = iVar2 + 1;
                  } while( true );
                }
                goto LAB_0127459c;
              }
              iVar1 = (&DAT_018a3fd8)[lVar6];
              iVar7 = 1;
LAB_0127444e:
              if (iVar7 != 5) {
                iVar2 = 0;
                do {
                  if (iVar2 == 2) {
                    for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_LAST;
                        SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                      pTVar4 = (TestNode *)operator_new(0x280);
                      UmulExtendedCase::UmulExtendedCase
                                ((UmulExtendedCase *)pTVar4,(this->super_TestCaseGroup).m_context,
                                 iVar1 + -1 + iVar7,PRECISION_HIGHP,SVar8);
                      tcu::TestNode::addChild(pTVar3,pTVar4);
                    }
                  }
                  else if (iVar2 == 3) goto LAB_012744b3;
                  iVar2 = iVar2 + 1;
                } while( true );
              }
              goto LAB_012744c1;
            }
            iVar1 = (&DAT_018a3fd8)[lVar6];
            for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
              for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST;
                  PVar9 = PVar9 + PRECISION_MEDIUMP) {
                for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_LAST;
                    SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
                  pTVar4 = (TestNode *)operator_new(0x280);
                  UsubBorrowCase::UsubBorrowCase
                            ((UsubBorrowCase *)pTVar4,(this->super_TestCaseGroup).m_context,
                             iVar1 + -1 + iVar7,PVar9,SVar8);
                  tcu::TestNode::addChild(pTVar3,pTVar4);
                }
              }
            }
          }
          lVar6 = lVar6 + 1;
        } while( true );
      }
      iVar1 = (&DAT_018a3fd8)[lVar6];
      for (iVar7 = 1; iVar7 != 5; iVar7 = iVar7 + 1) {
        for (PVar9 = PRECISION_LOWP; PVar9 != PRECISION_LAST; PVar9 = PVar9 + PRECISION_MEDIUMP) {
          for (SVar8 = SHADERTYPE_VERTEX; SVar8 != SHADERTYPE_LAST;
              SVar8 = SVar8 + SHADERTYPE_FRAGMENT) {
            pTVar4 = (TestNode *)operator_new(0x280);
            UaddCarryCase::UaddCarryCase
                      ((UaddCarryCase *)pTVar4,(this->super_TestCaseGroup).m_context,
                       iVar1 + -1 + iVar7,PVar9,SVar8);
            tcu::TestNode::addChild(pTVar3,pTVar4);
          }
        }
      }
    }
    lVar6 = lVar6 + 1;
  } while( true );
LAB_0127458e:
  iVar7 = iVar7 + 1;
  goto LAB_01274529;
LAB_012744b3:
  iVar7 = iVar7 + 1;
  goto LAB_0127444e;
}

Assistant:

void ShaderIntegerFunctionTests::init (void)
{
	enum
	{
		VS = (1<<glu::SHADERTYPE_VERTEX),
		FS = (1<<glu::SHADERTYPE_FRAGMENT),
		CS = (1<<glu::SHADERTYPE_COMPUTE),
		GS = (1<<glu::SHADERTYPE_GEOMETRY),
		TC = (1<<glu::SHADERTYPE_TESSELLATION_CONTROL),
		TE = (1<<glu::SHADERTYPE_TESSELLATION_EVALUATION),

		ALL_SHADERS = VS|TC|TE|GS|FS|CS
	};

	//																		Int?	Uint?	AllPrec?	Shaders
	addFunctionCases<UaddCarryCase>				(this,	"uaddcarry",		false,	true,	true,		ALL_SHADERS);
	addFunctionCases<UsubBorrowCase>			(this,	"usubborrow",		false,	true,	true,		ALL_SHADERS);
	addFunctionCases<UmulExtendedCase>			(this,	"umulextended",		false,	true,	false,		ALL_SHADERS);
	addFunctionCases<ImulExtendedCase>			(this,	"imulextended",		true,	false,	false,		ALL_SHADERS);
	addFunctionCases<BitfieldExtractCase>		(this,	"bitfieldextract",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitfieldInsertCase>		(this,	"bitfieldinsert",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitfieldReverseCase>		(this,	"bitfieldreverse",	true,	true,	true,		ALL_SHADERS);
	addFunctionCases<BitCountCase>				(this,	"bitcount",			true,	true,	true,		ALL_SHADERS);
	addFunctionCases<FindLSBCase>				(this,	"findlsb",			true,	true,	true,		ALL_SHADERS);
	addFunctionCases<FindMSBCase>				(this,	"findmsb",			true,	true,	true,		ALL_SHADERS);
}